

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O3

_Bool operator_int_cmp(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  long lVar1;
  _Bool _Var2;
  gravity_fiber_t *fiber;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar3;
  gravity_value_t value;
  gravity_value_t value_00;
  gravity_value_t gVar4;
  char _buffer [4096];
  char local_1018 [4096];
  
  lVar1 = (args->field_1).n;
  if (args[1].isa != gravity_class_float) {
    gVar4.field_1.n = args[1].field_1.n;
    gVar4.isa = args[1].isa;
    gVar4 = convert_value2int(vm,gVar4);
    if (gVar4.isa == (gravity_class_t *)0x0) {
      builtin_strncpy(local_1018 + 0x10,"t object to Int",0x10);
      builtin_strncpy(local_1018,"Unable to conver",0x10);
      fiber = gravity_vm_fiber(vm);
      gravity_fiber_seterror(fiber,local_1018);
      _Var2 = false;
      value.field_1.n = 0;
      value.isa = gravity_class_null;
      gravity_vm_setslot(vm,value,rindex);
    }
    else {
      if (lVar1 == gVar4.field_1.n) {
        aVar3.n = 0;
      }
      else if ((long)gVar4.field_1 < lVar1) {
        aVar3.n = 1;
      }
      else {
        aVar3.n = -1;
      }
      value_00.field_1.n = aVar3.n;
      value_00.isa = gravity_class_int;
      gravity_vm_setslot(vm,value_00,rindex);
      _Var2 = true;
    }
    return _Var2;
  }
  args->isa = gravity_class_float;
  (args->field_1).f = (double)lVar1;
  _Var2 = operator_float_cmp(vm,args,0,rindex);
  return _Var2;
}

Assistant:

static bool operator_int_cmp (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (VALUE_ISA_FLOAT(args[1])) {
        // args[0] is INT and args[1] is FLOAT, in this case
        // args[0] must be manually converted to FLOAT before the call
        args[0] = VALUE_FROM_FLOAT((gravity_float_t)args[0].n);
        return operator_float_cmp(vm, args, nargs, rindex);
    }

    DECLARE_2VARIABLES(v1, v2, 0, 1);
    INTERNAL_CONVERT_INT(v2, true);
    
    if (VALUE_ISA_VALID(v2)) {
        if (v1.n == v2.n) RETURN_VALUE(VALUE_FROM_INT(0), rindex);
        if (v1.n > v2.n) RETURN_VALUE(VALUE_FROM_INT(1), rindex);
    }
    
    RETURN_VALUE(VALUE_FROM_INT(-1), rindex);
}